

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int lls_qr_undetermined(double *Ai,double *bi,int M,int N,double *xo)

{
  int iVar1;
  double *col;
  double *bvec_00;
  double *Q_00;
  double *R_00;
  double *B;
  double *__ptr;
  double local_78;
  double sum;
  double *b;
  double *z;
  double *R;
  double *Q;
  double *bvec;
  double *A;
  int j;
  int l;
  int c1;
  int i;
  int retval;
  double *xo_local;
  int N_local;
  int M_local;
  double *bi_local;
  double *Ai_local;
  
  col = (double *)malloc((long)N * 8 * (long)M);
  bvec_00 = (double *)malloc((long)M << 3);
  Q_00 = (double *)malloc((long)N * 8 * (long)M);
  R_00 = (double *)malloc((long)M * 8 * (long)M);
  B = (double *)malloc((long)M << 3);
  __ptr = (double *)malloc((long)M << 3);
  for (A._4_4_ = 0; A._4_4_ < M; A._4_4_ = A._4_4_ + 1) {
    __ptr[A._4_4_] = bi[A._4_4_];
  }
  mtranspose(Ai,M,N,col);
  qrdecomp(col,N,M,bvec_00);
  getQR(col,N,M,bvec_00,Q_00,R_00);
  iVar1 = rank(R_00,M,M);
  itranspose(R_00,M,M);
  *B = *__ptr / *R_00;
  for (l = 1; l < M; l = l + 1) {
    local_78 = 0.0;
    for (A._4_4_ = 0; A._4_4_ < l; A._4_4_ = A._4_4_ + 1) {
      local_78 = R_00[l * M + A._4_4_] * B[A._4_4_] + local_78;
    }
    B[l] = (__ptr[l] - local_78) / R_00[l * M + l];
  }
  mmult(Q_00,B,xo,N,M,1);
  free(col);
  free(bvec_00);
  free(Q_00);
  free(R_00);
  free(B);
  free(__ptr);
  return iVar1;
}

Assistant:

static int lls_qr_undetermined(double *Ai,double *bi,int M,int N,double *xo) {
	int retval, i,c1,l,j;
	double *A, *bvec, *Q, *R, *z, *b;
	double sum;

	retval = 0;
	A = (double*) malloc(sizeof(double) * N * M);
	bvec = (double*) malloc(sizeof(double) * M);
	Q = (double*) malloc(sizeof(double) * N * M);
	R = (double*) malloc(sizeof(double) * M * M);
	z = (double*) malloc(sizeof(double) * M);
	b = (double*) malloc(sizeof(double) * M);

	for(j = 0; j < M;++j) {
		b[j] = bi[j];
	}

	mtranspose(Ai,M,N,A);
	// A NXM
	qrdecomp(A,N,M,bvec);

	getQR(A,N,M,bvec,Q,R);

	retval = rank(R,M,M);


	itranspose(R,M,M);

	// Forward Substitution

	z[0] = b[0] / R[0];

	for(i = 1; i < M;i++) {
		sum = 0.;
		c1 = i*M;
		l = i*M+i;

		for(j = 0; j < i;j++) {
			sum += R[c1 + j] * z[j];
		}
		z[i] = (b[i] - sum) / R[l];
	}


	mmult(Q,z,xo,N,M,1);

	free(A);
	free(bvec);
	free(Q);
	free(R);
	free(z);
	free(b);
	return retval;
}